

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

StringRef __thiscall llvm::sys::path::stem(path *this,StringRef path,Style style)

{
  char *pcVar1;
  char *pcVar2;
  StringRef SVar4;
  undefined1 auStack_48 [8];
  reverse_iterator I;
  char *pcVar3;
  
  I.Path.Data = path.Data;
  I.Path.Length = 0;
  I.Component.Data = (char *)0x0;
  I.Position._0_4_ = (undefined4)path.Length;
  auStack_48 = (undefined1  [8])this;
  I.Component.Length = (size_t)I.Path.Data;
  reverse_iterator::operator++((reverse_iterator *)auStack_48);
  pcVar3 = I.Component.Data;
  do {
    pcVar2 = pcVar3 + -1;
    if (pcVar3 == (char *)0x0) {
      pcVar2 = (char *)0xffffffffffffffff;
      break;
    }
    pcVar1 = pcVar3 + (I.Path.Length - 1);
    pcVar3 = pcVar2;
  } while (*pcVar1 != '.');
  if (pcVar2 != (char *)0xffffffffffffffff) {
    if (I.Component.Data == (char *)0x2) {
      if (*(short *)I.Path.Length == 0x2e2e) goto LAB_00b36889;
    }
    else if ((I.Component.Data == (char *)0x1) && (*(char *)I.Path.Length == '.'))
    goto LAB_00b36889;
    if (pcVar2 <= I.Component.Data) {
      I.Component.Data = pcVar2;
    }
  }
LAB_00b36889:
  SVar4.Length = (size_t)I.Component.Data;
  SVar4.Data = (char *)I.Path.Length;
  return SVar4;
}

Assistant:

StringRef stem(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return fname;
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return fname;
    else
      return fname.substr(0, pos);
}